

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_rcpt_resp(Curl_easy *data,connectdata *conn,int smtpcode,smtpstate instate)

{
  SMTP *pSVar1;
  bool bVar2;
  _Bool is_smtp_blocking_err;
  _Bool is_smtp_err;
  SMTP *smtp;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  smtp._4_4_ = CURLE_OK;
  pSVar1 = (data->req).p.smtp;
  bVar2 = false;
  if (smtpcode / 100 == 2) {
    pSVar1->field_0x28 = pSVar1->field_0x28 & 0xfe | 1;
  }
  else {
    bVar2 = (*(ulong *)&(data->set).field_0x89c >> 2 & 1) == 0;
    pSVar1->rcpt_last_error = smtpcode;
    if (bVar2) {
      Curl_failf(data,"RCPT failed: %d",(ulong)(uint)smtpcode);
      smtp._4_4_ = CURLE_SEND_ERROR;
    }
  }
  if (!bVar2) {
    pSVar1->rcpt = pSVar1->rcpt->next;
    if (pSVar1->rcpt == (curl_slist *)0x0) {
      if ((pSVar1->field_0x28 & 1) == 0) {
        Curl_failf(data,"RCPT failed: %d (last error)",(ulong)(uint)pSVar1->rcpt_last_error);
        smtp._4_4_ = CURLE_SEND_ERROR;
      }
      else {
        smtp._4_4_ = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","DATA");
        if (smtp._4_4_ == CURLE_OK) {
          smtp_state(data,SMTP_DATA);
        }
      }
    }
    else {
      smtp._4_4_ = smtp_perform_rcpt_to(data);
    }
  }
  return smtp._4_4_;
}

Assistant:

static CURLcode smtp_state_rcpt_resp(struct Curl_easy *data,
                                     struct connectdata *conn, int smtpcode,
                                     smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SMTP *smtp = data->req.p.smtp;
  bool is_smtp_err = FALSE;
  bool is_smtp_blocking_err = FALSE;

  (void)instate; /* no use for this yet */

  is_smtp_err = (smtpcode/100 != 2);

  /* If there is multiple RCPT TO to be issued, it is possible to ignore errors
     and proceed with only the valid addresses. */
  is_smtp_blocking_err = (is_smtp_err && !data->set.mail_rcpt_allowfails);

  if(is_smtp_err) {
    /* Remembering the last failure which we can report if all "RCPT TO" have
       failed and we cannot proceed. */
    smtp->rcpt_last_error = smtpcode;

    if(is_smtp_blocking_err) {
      failf(data, "RCPT failed: %d", smtpcode);
      result = CURLE_SEND_ERROR;
    }
  }
  else {
    /* Some RCPT TO commands have succeeded. */
    smtp->rcpt_had_ok = TRUE;
  }

  if(!is_smtp_blocking_err) {
    smtp->rcpt = smtp->rcpt->next;

    if(smtp->rcpt)
      /* Send the next RCPT TO command */
      result = smtp_perform_rcpt_to(data);
    else {
      /* We were not able to issue a successful RCPT TO command while going
         over recipients (potentially multiple). Sending back last error. */
      if(!smtp->rcpt_had_ok) {
        failf(data, "RCPT failed: %d (last error)", smtp->rcpt_last_error);
        result = CURLE_SEND_ERROR;
      }
      else {
        /* Send the DATA command */
        result = Curl_pp_sendf(data, &conn->proto.smtpc.pp, "%s", "DATA");

        if(!result)
          smtp_state(data, SMTP_DATA);
      }
    }
  }

  return result;
}